

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bag.h
# Opt level: O2

SourceOptions * __thiscall slang::Bag::get<slang::driver::SourceOptions>(Bag *this)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  value_type_pointer ppVar3;
  ulong uVar4;
  uint uVar5;
  bool bVar6;
  uint uVar7;
  size_t sVar8;
  SourceOptions *pSVar9;
  ulong uVar10;
  value_type_pointer __rhs;
  ulong uVar11;
  long lVar12;
  undefined1 auVar13 [16];
  type_index local_60;
  uchar local_58;
  uchar uStack_57;
  uchar uStack_56;
  byte bStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  byte bStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  byte bStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  byte bStack_49;
  uchar local_48;
  uchar uStack_47;
  uchar uStack_46;
  byte bStack_45;
  uchar uStack_44;
  uchar uStack_43;
  uchar uStack_42;
  byte bStack_41;
  uchar uStack_40;
  uchar uStack_3f;
  uchar uStack_3e;
  byte bStack_3d;
  uchar uStack_3c;
  uchar uStack_3b;
  uchar uStack_3a;
  byte bStack_39;
  
  local_60._M_target = (type_info *)&driver::SourceOptions::typeinfo;
  sVar8 = boost::unordered::detail::foa::mulx_mix::
          mix<slang::hash<std::type_index,void>,std::type_index>
                    ((hash<std::type_index,_void> *)this,&local_60);
  uVar11 = sVar8 >> ((byte)(this->items).table_.
                           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
                           .arrays.groups_size_index & 0x3f);
  lVar12 = (sVar8 & 0xff) * 4;
  local_58 = (&UNK_003fea9c)[lVar12];
  uStack_57 = (&UNK_003fea9d)[lVar12];
  uStack_56 = (&UNK_003fea9e)[lVar12];
  bStack_55 = (&UNK_003fea9f)[lVar12];
  uVar10 = 0;
  uStack_54 = local_58;
  uStack_53 = uStack_57;
  uStack_52 = uStack_56;
  bStack_51 = bStack_55;
  uStack_50 = local_58;
  uStack_4f = uStack_57;
  uStack_4e = uStack_56;
  bStack_4d = bStack_55;
  uStack_4c = local_58;
  uStack_4b = uStack_57;
  uStack_4a = uStack_56;
  bStack_49 = bStack_55;
  do {
    pgVar2 = (this->items).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
             .arrays.groups_;
    pgVar1 = pgVar2 + uVar11;
    local_48 = pgVar1->m[0].n;
    uStack_47 = pgVar1->m[1].n;
    uStack_46 = pgVar1->m[2].n;
    bStack_45 = pgVar1->m[3].n;
    uStack_44 = pgVar1->m[4].n;
    uStack_43 = pgVar1->m[5].n;
    uStack_42 = pgVar1->m[6].n;
    bStack_41 = pgVar1->m[7].n;
    uStack_40 = pgVar1->m[8].n;
    uStack_3f = pgVar1->m[9].n;
    uStack_3e = pgVar1->m[10].n;
    bStack_3d = pgVar1->m[0xb].n;
    uStack_3c = pgVar1->m[0xc].n;
    uStack_3b = pgVar1->m[0xd].n;
    uStack_3a = pgVar1->m[0xe].n;
    bStack_39 = pgVar1->m[0xf].n;
    auVar13[0] = -(local_48 == local_58);
    auVar13[1] = -(uStack_47 == uStack_57);
    auVar13[2] = -(uStack_46 == uStack_56);
    auVar13[3] = -(bStack_45 == bStack_55);
    auVar13[4] = -(uStack_44 == uStack_54);
    auVar13[5] = -(uStack_43 == uStack_53);
    auVar13[6] = -(uStack_42 == uStack_52);
    auVar13[7] = -(bStack_41 == bStack_51);
    auVar13[8] = -(uStack_40 == uStack_50);
    auVar13[9] = -(uStack_3f == uStack_4f);
    auVar13[10] = -(uStack_3e == uStack_4e);
    auVar13[0xb] = -(bStack_3d == bStack_4d);
    auVar13[0xc] = -(uStack_3c == uStack_4c);
    auVar13[0xd] = -(uStack_3b == uStack_4b);
    auVar13[0xe] = -(uStack_3a == uStack_4a);
    auVar13[0xf] = -(bStack_39 == bStack_49);
    uVar7 = (uint)(ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe);
    if (uVar7 != 0) {
      ppVar3 = (this->items).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
               .arrays.elements_;
      do {
        uVar5 = 0;
        if (uVar7 != 0) {
          for (; (uVar7 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
          }
        }
        __rhs = ppVar3 + uVar11 * 0xf + (ulong)uVar5;
        bVar6 = std::type_index::operator==(&local_60,&__rhs->first);
        if (bVar6) {
          pSVar9 = std::any_cast<slang::driver::SourceOptions>(&__rhs->second);
          return pSVar9;
        }
        uVar7 = uVar7 - 1 & uVar7;
      } while (uVar7 != 0);
      bStack_39 = pgVar2[uVar11].m[0xf].n;
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)sVar8 & 7] & bStack_39) == 0) {
      return (SourceOptions *)0x0;
    }
    uVar4 = (this->items).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
            .arrays.groups_size_mask;
    lVar12 = uVar11 + uVar10;
    uVar10 = uVar10 + 1;
    uVar11 = lVar12 + 1U & uVar4;
  } while (uVar10 <= uVar4);
  return (SourceOptions *)0x0;
}

Assistant:

const T* get() const {
        auto it = items.find(SLANG_TYPEOF(T));
        if (it == items.end())
            return nullptr;
        return std::any_cast<T>(&it->second);
    }